

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

void __thiscall
Wasm::WasmBytecodeGenerator::ExitEvalStackScope(WasmBytecodeGenerator *this,BlockInfo *blockInfo)

{
  Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer> *this_00;
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  EmitInfo EVar5;
  WasmCompilationException *this_01;
  char16 local_438 [4];
  char16 buf [512];
  
  if ((this->m_evalStack).list.
      super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x842,"(!m_evalStack.Empty())","!m_evalStack.Empty()");
    if (!bVar3) {
LAB_00f30e83:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this_00 = &this->m_evalStack;
  EVar5 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
                    (this_00);
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if ((ulong)EVar5 >> 0x20 != 8) {
      if (EVar5.type == Limit) {
        return;
      }
      JsUtil::
      List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      EnsureArray(&this_00->list,0);
      (this->m_evalStack).list.
      super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.buffer
      [(this->m_evalStack).list.
       super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count] = EVar5;
      pTVar1 = &(this->m_evalStack).list.
                super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count;
      *pTVar1 = *pTVar1 + 1;
      memset(local_438,0,0x400);
      WriteTypeStackToString(this,local_438,0x200);
      this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_01,L"Expected stack to be empty, but has %s",local_438);
      __cxa_throw(this_01,&WasmCompilationException::typeinfo,
                  WasmCompilationException::~WasmCompilationException);
    }
    if ((this->m_evalStack).list.
        super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                         ,0x847,"(!m_evalStack.Empty())","!m_evalStack.Empty()");
      if (!bVar3) goto LAB_00f30e83;
      *puVar4 = 0;
    }
    EVar5 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
                      (this_00);
  } while( true );
}

Assistant:

void WasmBytecodeGenerator::ExitEvalStackScope(const BlockInfo* blockInfo)
{
    Assert(!m_evalStack.Empty());
    EmitInfo info = m_evalStack.Pop();
    // It is possible to have unconsumed Any type left on the stack, simply remove them
    while (info.type == WasmTypes::Any)
    {
        Assert(!m_evalStack.Empty());
        info = m_evalStack.Pop();
    }
    if (info.type != WasmTypes::Limit)
    {
        // Put info back on stack so we can write it to string
        m_evalStack.Push(info);
        char16 buf[512] = { 0 };
        WriteTypeStackToString(buf, 512);
        throw WasmCompilationException(_u("Expected stack to be empty, but has %s"), buf);
    }
}